

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O0

ssize_t __thiscall
Imf_2_5::StdIFStream::read(StdIFStream *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  ulong uVar2;
  InputExc *this_00;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  streamsize in_stack_000001a0;
  istream *in_stack_000001a8;
  
  uVar2 = std::ios::operator!((ios *)(this->_is + *(long *)(*(long *)this->_is + -0x18)));
  if ((uVar2 & 1) == 0) {
    anon_unknown_2::clearError();
    std::istream::read((char *)this->_is,CONCAT44(in_register_00000034,__fd));
    bVar1 = anon_unknown_2::checkError(in_stack_000001a8,in_stack_000001a0);
    return CONCAT71(extraout_var,bVar1);
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this_00,"Unexpected end of file.");
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

bool
StdIFStream::read (char c[/*n*/], int n)
{
    if (!*_is)
        throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

    clearError();
    _is->read (c, n);
    return checkError (*_is, n);
}